

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

void __thiscall gguf_writer::pad(gguf_writer *this,size_t alignment)

{
  int8_t zero;
  char local_19;
  
  if ((ulong)((long)(this->buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) % alignment != 0) {
    do {
      local_19 = '\0';
      write<signed_char>(this,&local_19);
    } while ((ulong)((long)(this->buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->buf->super__Vector_base<signed_char,_std::allocator<signed_char>_>)
                          ._M_impl.super__Vector_impl_data._M_start) % alignment != 0);
  }
  return;
}

Assistant:

void pad(const size_t alignment) const {
        while (buf.size() % alignment != 0) {
            const int8_t zero = 0;
            write(zero);
        }
    }